

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10_dynamic_dofs_waypoints.cpp
# Opt level: O2

int main(void)

{
  Result RVar1;
  ostream *poVar2;
  allocator_type *__a;
  long lVar3;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  allocator_type local_954;
  allocator_type local_953;
  allocator_type local_952;
  allocator_type local_951;
  double local_950;
  undefined1 local_948 [48];
  vector<double,_std::allocator<double>_> local_918;
  vector<double,_std::allocator<double>_> local_900;
  double local_8e8 [4];
  double local_8c8 [4];
  double local_8a8 [4];
  double local_888 [4];
  OutputParameter<0UL,_ruckig::StandardVector> output;
  InputParameter<0UL,_ruckig::StandardVector> input;
  Ruckig<0UL,_ruckig::StandardVector,_false> otg;
  
  ruckig::Ruckig<0UL,_ruckig::StandardVector,_false>::Ruckig<0UL,_0>(&otg,3,0.01,10);
  ruckig::InputParameter<0UL,_ruckig::StandardVector>::InputParameter<0UL,_0>(&input,3);
  ruckig::OutputParameter<0UL,_ruckig::StandardVector>::OutputParameter<0UL,_0>(&output,3,10);
  local_948._0_4_ = 0x9999999a;
  local_948._4_4_ = 0x3fc99999;
  local_948._8_4_ = 0;
  local_948._12_4_ = 0;
  local_948._16_8_ = (pointer)0xbfd3333333333333;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&input.current_position,local_948);
  local_948._0_4_ = 0;
  local_948._4_4_ = 0;
  local_948._8_4_ = 0x9999999a;
  local_948._12_4_ = 0x3fc99999;
  local_948._16_8_ = (pointer)0x0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&input.current_velocity,local_948);
  local_948._0_4_ = 0;
  local_948._4_4_ = 0;
  local_948._8_4_ = 0x33333333;
  local_948._12_4_ = 0x3fe33333;
  local_948._16_8_ = (pointer)0x0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&input.current_acceleration,local_948,
             (vector<double,_std::allocator<double>_> *)(local_948 + 0x18));
  local_888[0] = 1.4;
  local_888[1] = -1.6;
  local_888[2] = 1.0;
  __l._M_len = 3;
  __l._M_array = local_888;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_948,__l,&local_951);
  local_8a8[0] = -0.6;
  local_8a8[1] = -0.5;
  local_8a8[2] = 0.4;
  __l_00._M_len = 3;
  __l_00._M_array = local_8a8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_948 + 0x18),__l_00,&local_952);
  local_8c8[0] = -0.4;
  local_8c8[1] = -0.35;
  local_8c8[2] = 0.0;
  __l_01._M_len = 3;
  __l_01._M_array = local_8c8;
  std::vector<double,_std::allocator<double>_>::vector(&local_918,__l_01,&local_953);
  local_8e8[0] = 0.8;
  local_8e8[1] = 1.8;
  local_8e8[2] = -0.1;
  __a = &local_954;
  __l_02._M_len = 3;
  __l_02._M_array = local_8e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_900,__l_02,__a);
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::_M_assign_aux<std::vector<double,std::allocator<double>>const*>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&input.intermediate_positions,local_948,local_8e8);
  lVar3 = 0x48;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)(local_948 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  local_948._0_4_ = 0;
  local_948._4_4_ = 0x3fe00000;
  local_948._8_4_ = 0;
  local_948._12_4_ = 0x3ff00000;
  local_948._16_8_ = (pointer)0x0;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&input.target_position,local_948);
  local_948._0_4_ = 0x9999999a;
  local_948._4_4_ = 0x3fc99999;
  local_948._8_4_ = 0;
  local_948._12_4_ = 0;
  local_948._16_8_ = (pointer)0x3fd3333333333333;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&input.target_velocity,local_948);
  local_948._0_4_ = 0;
  local_948._4_4_ = 0;
  local_948._8_4_ = 0x9999999a;
  local_948._12_4_ = 0x3fb99999;
  local_948._16_8_ = (pointer)0xbfb999999999999a;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&input.target_acceleration,local_948);
  local_948._0_4_ = 0;
  local_948._4_4_ = 0x3ff00000;
  local_948._8_4_ = 0;
  local_948._12_4_ = 0x40000000;
  local_948._16_8_ = (pointer)0x3ff0000000000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&input.max_velocity,local_948);
  local_948._0_4_ = 0;
  local_948._4_4_ = 0x40080000;
  local_948._8_4_ = 0;
  local_948._12_4_ = 0x40000000;
  local_948._16_8_ = (pointer)0x4000000000000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&input.max_acceleration,local_948);
  local_948._0_4_ = 0;
  local_948._4_4_ = 0x40180000;
  local_948._8_4_ = 0;
  local_948._12_4_ = 0x40240000;
  local_948._16_8_ = (pointer)0x4034000000000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&input.max_jerk,local_948);
  poVar2 = std::operator<<((ostream *)&std::cout,"t | position");
  std::endl<char,std::char_traits<char>>(poVar2);
  local_950 = 0.0;
  while( true ) {
    RVar1 = ruckig::Ruckig<0UL,_ruckig::StandardVector,_false>::update(&otg,&input,&output);
    if (RVar1 != Working) break;
    poVar2 = std::ostream::_M_insert<double>(output.time);
    poVar2 = std::operator<<(poVar2," | ");
    ruckig::join<std::vector<double,std::allocator<double>>>
              ((string *)local_948,(ruckig *)&output.new_position,
               (vector<double,_std::allocator<double>_> *)0x0,SUB81(__a,0));
    poVar2 = std::operator<<(poVar2,(string *)local_948);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)local_948);
    ruckig::OutputParameter<0UL,_ruckig::StandardVector>::pass_to_input(&output,&input);
    if (output.new_calculation != false) {
      local_950 = output.calculation_duration;
    }
  }
  std::operator<<((ostream *)&std::cout,"Reached target position in ");
  poVar2 = std::ostream::_M_insert<double>(output.trajectory.duration);
  poVar2 = std::operator<<(poVar2," [s].");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"Calculation in ");
  poVar2 = std::ostream::_M_insert<double>(local_950);
  poVar2 = std::operator<<(poVar2,anon_var_dwarf_2035d);
  std::endl<char,std::char_traits<char>>(poVar2);
  ruckig::OutputParameter<0UL,_ruckig::StandardVector>::~OutputParameter(&output);
  ruckig::InputParameter<0UL,_ruckig::StandardVector>::~InputParameter(&input);
  ruckig::Ruckig<0UL,_ruckig::StandardVector,_false>::~Ruckig(&otg);
  return 0;
}

Assistant:

int main() {
    double control_cycle = 0.01;
    size_t DOFs = 3;
    size_t max_number_of_waypoints = 10;  // for memory allocation

    // Create instances: the Ruckig OTG as well as input and output parameters
    Ruckig<DynamicDOFs> otg(DOFs, control_cycle, max_number_of_waypoints);
    InputParameter<DynamicDOFs> input(DOFs);
    OutputParameter<DynamicDOFs> output(DOFs, max_number_of_waypoints);

    // Set input parameters
    input.current_position = {0.2, 0.0, -0.3};
    input.current_velocity = {0.0, 0.2, 0.0};
    input.current_acceleration = {0.0, 0.6, 0.0};

    input.intermediate_positions = {
        {1.4, -1.6, 1.0},
        {-0.6, -0.5, 0.4},
        {-0.4, -0.35, 0.0},
        {0.8, 1.8, -0.1}
    };

    input.target_position = {0.5, 1.0, 0.0};
    input.target_velocity = {0.2, 0.0, 0.3};
    input.target_acceleration = {0.0, 0.1, -0.1};

    input.max_velocity = {1.0, 2.0, 1.0};
    input.max_acceleration = {3.0, 2.0, 2.0};
    input.max_jerk = {6.0, 10.0, 20.0};

    std::cout << "t | position" << std::endl;
    double calculation_duration = 0.0;
    while (otg.update(input, output) == Result::Working) {
        std::cout << output.time << " | " << join(output.new_position) << std::endl;

        output.pass_to_input(input);

        if (output.new_calculation) {
            calculation_duration = output.calculation_duration;
        }
    }

    std::cout << "Reached target position in " << output.trajectory.get_duration() << " [s]." << std::endl;
    std::cout << "Calculation in " << calculation_duration << " [µs]." << std::endl;
}